

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

LispPTR COM_next_file(LispPTR *args)

{
  uint uVar1;
  FINFO *pFVar2;
  ulong uVar3;
  FPROP *pFVar4;
  DLword *pDVar5;
  DLword *pDVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  long lVar10;
  ulong uVar11;
  
  iVar7 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar7 != 0) {
    *Lisp_errno = 100;
    return 0xfffff;
  }
  Lisp_errno = &Dummy_errno;
  uVar8 = *args;
  if ((uVar8 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
  }
  pDVar5 = Lisp_world;
  lVar10 = (long)*(int *)(Lisp_world + uVar8);
  if (lVar10 < 0) {
    return 0xfffff;
  }
  if (MAXFINFO <= *(int *)(Lisp_world + uVar8)) {
    return 0xfffff;
  }
  pFVar2 = FinfoArray[lVar10].next;
  if (pFVar2 == (FINFO *)0x0 || FinfoArray[lVar10].head == (FINFO *)0x0) {
    return 0xfffff;
  }
  iVar7 = *(int *)(Lisp_world + (ulong)uVar8 + 8);
  FinfoArray[lVar10].next = pFVar2->next;
  uVar1 = *(uint *)(pDVar5 + (ulong)uVar8 + 0xe);
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  pDVar6 = Lisp_world;
  if (pFVar2->lname_len == 0) {
    if (-1 < iVar7) {
      uVar8 = 0;
      goto LAB_00118edb;
    }
LAB_00118e41:
    pFVar4 = pFVar2->prop;
    *(uint *)(pDVar5 + (ulong)uVar8 + 0x10) = pFVar4->length;
    *(uint *)(pDVar5 + (ulong)uVar8 + 0x12) = pFVar4->wdate;
    *(uint *)(pDVar5 + (ulong)uVar8 + 0x14) = pFVar4->rdate;
    *(uint *)(pDVar5 + (ulong)uVar8 + 0x16) = pFVar4->protect;
    uVar1 = *(uint *)(pDVar5 + (ulong)uVar8 + 0x18);
    if ((uVar1 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
    }
    pDVar6 = Lisp_world;
    if (pFVar4->au_len == 0) {
      uVar9 = 0;
    }
    else {
      uVar1 = *(uint *)(Lisp_world + uVar1);
      uVar11 = 0;
      do {
        *(char *)((long)pDVar6 + uVar11 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3) =
             pFVar4->author[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar11 < pFVar4->au_len);
      uVar9 = (undefined4)pFVar4->au_len;
    }
    *(undefined4 *)(pDVar5 + (ulong)uVar8 + 0x1a) = uVar9;
    uVar3 = pFVar2->lname_len;
  }
  else {
    uVar1 = *(uint *)(Lisp_world + uVar1);
    uVar11 = 0;
    do {
      *(char *)((long)pDVar6 + uVar11 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3) = pFVar2->lname[uVar11];
      uVar11 = uVar11 + 1;
      uVar3 = pFVar2->lname_len;
    } while (uVar11 < uVar3);
    if (iVar7 < 0) goto LAB_00118e41;
  }
  uVar8 = (uint)uVar3;
  if (0xffff < uVar3) {
    error("Not Smallp data");
    return 0xe0000;
  }
LAB_00118edb:
  return uVar8 | 0xe0000;
}

Assistant:

LispPTR COM_next_file(LispPTR *args)
{
  LispPTR laddr;
  FPROP *pp;
  FINFO *fp;
  char *base;
  DFINFO *dfp;
  UFSGFS *gfsp;
  int finfoid;
  unsigned propp;

  ERRSETJMP(SMALLP_MINUSONE);
  Lisp_errno = &Dummy_errno;

  gfsp = (UFSGFS *)(NativeAligned4FromLAddr(args[0]));

  finfoid = (int)gfsp->finfoid;

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (SMALLP_MINUSONE);

  propp = gfsp->propp;

  dfp = &FinfoArray[finfoid];
  fp = dfp->next;
  if (dfp->head == NULL || fp == NULL) return (SMALLP_MINUSONE);
  dfp->next = fp->next;

  laddr = gfsp->name;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, fp->lname, fp->lname_len);
#else
  StrNCpyFromCToLisp(base, fp->lname, fp->lname_len);
#endif /* BYTESWAP	 */

  if (!propp) return (GetPosSmallp(fp->lname_len));

  pp = fp->prop;
  gfsp->length = pp->length;
  gfsp->wdate = pp->wdate;
  gfsp->rdate = pp->rdate;
  gfsp->protection = pp->protect;

  laddr = gfsp->author;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, pp->author, pp->au_len);
#else
  StrNCpyFromCToLisp(base, pp->author, pp->au_len);
#endif /* BYTESWAP	 */

  gfsp->aulen = pp->au_len;

  return (GetPosSmallp(fp->lname_len));
}